

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sumStep(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  SumCtx *pSum;
  sqlite3_int64 iB;
  long in_FS_OFFSET;
  double dVar2;
  int type;
  SumCtx *p;
  i64 x;
  sqlite3_context *in_stack_ffffffffffffffa8;
  sqlite3_value *in_stack_ffffffffffffffb0;
  i64 in_stack_ffffffffffffffb8;
  SumCtx *in_stack_ffffffffffffffc0;
  i64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pSum = (SumCtx *)sqlite3_aggregate_context(in_stack_ffffffffffffffa8,0);
  iVar1 = sqlite3_value_numeric_type(in_stack_ffffffffffffffb0);
  if ((pSum != (SumCtx *)0x0) && (iVar1 != 5)) {
    pSum->cnt = pSum->cnt + 1;
    if (pSum->approx == '\0') {
      if (iVar1 == 1) {
        local_10 = pSum->iSum;
        iB = sqlite3_value_int64((sqlite3_value *)0x22573e);
        iVar1 = sqlite3AddInt64(&local_10,iB);
        if (iVar1 == 0) {
          pSum->iSum = local_10;
        }
        else {
          pSum->ovrfl = '\x01';
          kahanBabuskaNeumaierInit(pSum,pSum->iSum);
          pSum->approx = '\x01';
          sqlite3_value_int64((sqlite3_value *)0x22579c);
          kahanBabuskaNeumaierStepInt64(in_stack_ffffffffffffffc0,(i64)pSum);
        }
      }
      else {
        kahanBabuskaNeumaierInit(pSum,pSum->iSum);
        pSum->approx = '\x01';
        dVar2 = sqlite3_value_double((sqlite3_value *)0x225714);
        kahanBabuskaNeumaierStep(pSum,dVar2);
      }
    }
    else if (iVar1 == 1) {
      sqlite3_value_int64((sqlite3_value *)0x2257cb);
      kahanBabuskaNeumaierStepInt64(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      pSum->ovrfl = '\0';
      dVar2 = sqlite3_value_double((sqlite3_value *)0x2257f9);
      kahanBabuskaNeumaierStep(pSum,dVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void sumStep(sqlite3_context *context, int argc, sqlite3_value **argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  if( p && type!=SQLITE_NULL ){
    p->cnt++;
    if( p->approx==0 ){
      if( type!=SQLITE_INTEGER ){
        kahanBabuskaNeumaierInit(p, p->iSum);
        p->approx = 1;
        kahanBabuskaNeumaierStep(p, sqlite3_value_double(argv[0]));
      }else{
        i64 x = p->iSum;
        if( sqlite3AddInt64(&x, sqlite3_value_int64(argv[0]))==0 ){
          p->iSum = x;
        }else{
          p->ovrfl = 1;
          kahanBabuskaNeumaierInit(p, p->iSum);
          p->approx = 1;
          kahanBabuskaNeumaierStepInt64(p, sqlite3_value_int64(argv[0]));
        }
      }
    }else{
      if( type==SQLITE_INTEGER ){
        kahanBabuskaNeumaierStepInt64(p, sqlite3_value_int64(argv[0]));
      }else{
        p->ovrfl = 0;
        kahanBabuskaNeumaierStep(p, sqlite3_value_double(argv[0]));
      }
    }
  }
}